

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall CTPNMemArgBase::adjust_for_dyn(CTPNMemArgBase *this,tcpn_dyncomp_info *info)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (info->speculative == 0) {
    iVar1 = (*(this->obj_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])();
    this->obj_expr_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
    iVar1 = (*(this->prop_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])
                      (this->prop_expr_,info);
    this->prop_expr_ = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar1);
    (*(this->arglist_->super_CTPNArglistBase).super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[0x11])(this->arglist_,info);
    return &this->super_CTcPrsNode;
  }
  err_throw(0x9c5);
}

Assistant:

CTcPrsNode *CTPNMemArgBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* don't allow in speculative mode due to possible side effects */
    if (info->speculative)
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* 
     *   adjust my object expression, property expression, and argument
     *   list 
     */
    obj_expr_ = obj_expr_->adjust_for_dyn(info);
    prop_expr_ = prop_expr_->adjust_for_dyn(info);
    arglist_->adjust_for_dyn(info);

    /* return myself otherwise unchanged */
    return this;
}